

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int RunPCIScan(undefined8 param_1,undefined4 param_2,undefined8 param_3,Commandline *param_4)

{
  byte bVar1;
  ostream *poVar2;
  ostream *poVar3;
  RouterAccess device;
  allocator local_81;
  string local_80;
  RouterAccess local_60 [88];
  
  bhf::ads::RouterAccess::RouterAccess(local_60,param_3,param_1,param_2);
  std::__cxx11::string::string((string *)&local_80,"pciscan pci_id is missing",&local_81);
  poVar2 = (ostream *)bhf::Commandline::Pop<unsigned_long>(param_4,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  poVar3 = (ostream *)((long)poVar2 << 0x20);
  if ((ulong)poVar2 >> 0x20 != 0) {
    poVar3 = poVar2;
  }
  bVar1 = bhf::ads::RouterAccess::PciScan((ulong)local_60,poVar3);
  AdsDevice::~AdsDevice((AdsDevice *)local_60);
  return (uint)bVar1;
}

Assistant:

int RunPCIScan(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    const auto device = bhf::ads::RouterAccess{ gw, netid, port };
    auto pciId = args.Pop<uint64_t>("pciscan pci_id is missing");

    /* allow subVendorId/SystemId to be omitted from cmd */
    if (std::numeric_limits<uint32_t>::max() >= pciId) {
        pciId <<= 32;
    }
    return device.PciScan(pciId, std::cout);
}